

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::setJointPos(KinDynComputations *this,Span<const_double,__1L> s)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  long lVar2;
  VectorDynSize *vec;
  extent_type<_1L> eVar3;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> MStack_58;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_40;
  
  eVar3 = s.storage_.super_extent_type<_1L>.size_;
  lVar2 = iDynTree::Model::getNrOfPosCoords();
  if (lVar2 == eVar3.size_) {
    local_40.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = s.storage_.data_;
    local_40.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_rows.m_value = eVar3.size_;
    vec = (VectorDynSize *)iDynTree::FreeFloatingPos::jointPos();
    toEigen(&MStack_58,vec);
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
              (&MStack_58,&local_40);
    pKVar1 = this->pimpl;
    pKVar1->m_isFwdKinematicsUpdated = false;
    pKVar1->m_isRawMassMatrixUpdated = false;
    pKVar1->m_areBiasAccelerationsUpdated = false;
  }
  else {
    iDynTree::reportError("KinDynComputations","setJointPos","Wrong size in input joint positions");
  }
  return lVar2 == eVar3.size_;
}

Assistant:

bool KinDynComputations::setJointPos(Span<const double> s)
{
    bool ok = (s.size() == pimpl->m_robot_model.getNrOfPosCoords());
    if( !ok )
    {
        reportError("KinDynComputations","setJointPos","Wrong size in input joint positions");
        return false;
    }

    toEigen(this->pimpl->m_pos.jointPos()) = toEigen(s);

    // Invalidate cache
    this->invalidateCache();

    return true;
}